

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O1

void __thiscall
FIX::SocketMonitor::processWrite(SocketMonitor *this,Strategy *strategy,socket_handle socket_fd)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  undefined4 in_register_00000014;
  ulong uVar4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar6;
  socket_handle s;
  uint local_24;
  
  uVar4 = CONCAT44(in_register_00000014,socket_fd);
  p_Var1 = &(this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < socket_fd])
  {
    if (socket_fd <= (int)p_Var5[1]._M_color) {
      p_Var3 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var5 = p_Var3, socket_fd < (int)p_Var3[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  local_24 = socket_fd;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    lVar2 = 0x20;
  }
  else {
    pVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            equal_range(&(this->m_connectSockets)._M_t,(key_type *)&local_24);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&(this->m_connectSockets)._M_t,(_Base_ptr)pVar6.first._M_node,
               (_Base_ptr)pVar6.second._M_node);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->m_readSockets,(int *)&local_24);
    lVar2 = 0x10;
    uVar4 = (ulong)local_24;
  }
  (**(code **)((long)strategy->_vptr_Strategy + lVar2))(strategy,this,uVar4);
  return;
}

Assistant:

void SocketMonitor::processWrite(Strategy &strategy, socket_handle socket_fd) {
  socket_handle s = socket_fd;
  if (m_connectSockets.find(s) != m_connectSockets.end()) {
    m_connectSockets.erase(s);
    m_readSockets.insert(s);
    strategy.onConnect(*this, s);
  } else {
    strategy.onWrite(*this, s);
  }
}